

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O3

void __thiscall Assimp::LWOImporter::LoadLWO2File(LWOImporter *this)

{
  size_t *psVar1;
  _List_node_base **this_00;
  pointer pFVar2;
  pointer pFVar3;
  list<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_> *this_01;
  _List_node_base *p_Var4;
  uint8_t *puVar5;
  pointer paVar6;
  pointer paVar7;
  _List_node_base *p_Var8;
  bool bVar9;
  ushort uVar10;
  int iVar11;
  uint *puVar12;
  _Node *p_Var13;
  uint8_t *puVar14;
  Logger *pLVar15;
  runtime_error *prVar16;
  uint uVar17;
  uint uVar18;
  char *message;
  uint *puVar20;
  bool bVar21;
  uint *puVar22;
  uint uVar23;
  char buffer [128];
  undefined1 local_188 [144];
  undefined **local_f8;
  _Alloc_hider local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  uint local_d0;
  pointer local_c8;
  pointer pfStack_c0;
  pointer local_b8;
  _Bit_type *p_Stack_b0;
  uint local_a8;
  _Bit_type *local_a0;
  uint local_98;
  _Bit_pointer local_90;
  pointer local_88;
  pointer pFStack_80;
  pointer local_78;
  undefined8 uStack_70;
  uint16_t local_68;
  uint16_t local_66;
  _Alloc_hider local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  undefined1 local_40 [16];
  ulong uVar19;
  
  if (7 < (ulong)this->fileSize) {
    puVar20 = (uint *)this->mFileBuffer;
    puVar22 = (uint *)((ulong)this->fileSize + (long)puVar20);
    puVar12 = puVar20 + 2;
    bVar21 = false;
    do {
      uVar23 = *puVar20;
      this->mFileBuffer = (uint8_t *)(puVar20 + 1);
      uVar17 = puVar20[1];
      this->mFileBuffer = (uint8_t *)puVar12;
      uVar18 = uVar23 >> 0x18 | (uVar23 & 0xff0000) >> 8 |
               (uint)(((ulong)uVar23 << 0x20) >> 0x18) & 0xff0000 |
               (uint)(((ulong)uVar23 << 0x20) >> 8);
      uVar19 = ((ulong)uVar17 & 0xff000000) << 8 | ((ulong)uVar17 & 0xff0000) << 0x18 |
               ((ulong)uVar17 & 0xff00) << 0x28 | CONCAT44(uVar23,uVar17) << 0x38;
      puVar20 = (uint *)((long)puVar12 + (uVar19 >> 0x20));
      if (puVar22 < puVar20) {
        prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_188._0_8_ = local_188 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_188,"LWO2: Chunk length points behind the file","");
        std::runtime_error::runtime_error(prVar16,(string *)local_188);
        *(undefined ***)prVar16 = &PTR__runtime_error_007fc4b8;
        __cxa_throw(prVar16,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      if (uVar19 >> 0x20 != 0) {
        uVar23 = (uint)(uVar19 >> 0x20);
        if ((int)uVar18 < 0x50544147) {
          if ((int)uVar18 < 0x4c415952) {
            if (uVar18 == 0x434c4950) {
              LoadLWO2Clip(this,uVar23);
            }
            else if (uVar18 == 0x454e564c) {
              LoadLWO2Envelope(this,uVar23);
            }
          }
          else if (uVar18 == 0x4c415952) {
            this_01 = this->mLayers;
            memset(local_188,0,0x90);
            local_f0._M_p = (pointer)&local_e0;
            local_e8 = 0;
            local_e0._M_local_buf[0] = '\0';
            local_d0 = 3;
            local_a0 = (_Bit_type *)0x0;
            local_98 = 0;
            local_90 = (_Bit_pointer)0x0;
            local_c8 = (pointer)0x0;
            pfStack_c0 = (pointer)0x0;
            local_b8 = (pointer)0x0;
            p_Stack_b0 = (_Bit_type *)0x0;
            local_a8 = 0;
            local_f8 = &PTR__VMapEntry_007ff4f8;
            local_78 = (pointer)0x0;
            uStack_70._0_4_ = 0;
            uStack_70._4_4_ = 0;
            local_88 = (pointer)0x0;
            pFStack_80 = (pointer)0x0;
            local_68 = 0;
            local_66 = 0xffff;
            local_60._M_p = (pointer)&local_50;
            local_58 = 0;
            local_50._M_local_buf[0] = '\0';
            local_40._0_5_ = 0;
            local_40._5_3_ = 0;
            local_40._8_4_ = 0.0;
            local_40[0xc] = false;
            p_Var13 = std::__cxx11::list<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_>::
                      _M_create_node<Assimp::LWO::Layer>(this_01,(Layer *)local_188);
            std::__detail::_List_node_base::_M_hook(&p_Var13->super__List_node_base);
            psVar1 = &(this_01->
                      super__List_base<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_>).
                      _M_impl._M_node._M_size;
            *psVar1 = *psVar1 + 1;
            LWO::Layer::~Layer((Layer *)local_188);
            p_Var4 = (this->mLayers->
                     super__List_base<Assimp::LWO::Layer,_std::allocator<Assimp::LWO::Layer>_>).
                     _M_impl._M_node.super__List_node_base._M_prev;
            this->mCurLayer = (Layer *)(p_Var4 + 1);
            if (uVar19 >> 0x24 == 0) {
              prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_188._0_8_ = local_188 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_188,"LWO: LAYR chunk is too small","");
              std::runtime_error::runtime_error(prVar16,(string *)local_188);
              *(undefined ***)prVar16 = &PTR__runtime_error_007fc4b8;
              __cxa_throw(prVar16,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            uVar10 = *(ushort *)this->mFileBuffer;
            uVar10 = uVar10 << 8 | uVar10 >> 8;
            this->mFileBuffer = (uint8_t *)((long)this->mFileBuffer + 2);
            *(ushort *)((long)&p_Var4[0x13]._M_next + 2) = uVar10;
            if ((this->configLayerIndex == 0xffffffff) ||
               (bVar9 = true, this->configLayerIndex - 1 == (uint)uVar10)) {
              bVar9 = false;
            }
            puVar5 = this->mFileBuffer;
            this->mFileBuffer = puVar5 + 2;
            uVar17 = *(uint *)(puVar5 + 2);
            this->mFileBuffer = puVar5 + 6;
            (this->mCurLayer->mPivot).x =
                 (float)(uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 |
                        uVar17 << 0x18);
            uVar17 = *(uint *)this->mFileBuffer;
            this->mFileBuffer = (uint8_t *)((long)this->mFileBuffer + 4);
            (this->mCurLayer->mPivot).y =
                 (float)(uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 |
                        uVar17 << 0x18);
            uVar17 = *(uint *)this->mFileBuffer;
            this->mFileBuffer = (uint8_t *)((long)this->mFileBuffer + 4);
            (this->mCurLayer->mPivot).z =
                 (float)(uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 |
                        uVar17 << 0x18);
            puVar5 = this->mFileBuffer;
            puVar14 = puVar5;
            if (*puVar5 != '\0') {
              uVar17 = 1;
              do {
                puVar14 = puVar14 + 1;
                if (uVar23 - 0x10 < uVar17) {
                  pLVar15 = DefaultLogger::get();
                  Logger::warn(pLVar15,"LWO: Invalid file, string is is too long");
                  puVar14 = this->mFileBuffer;
                  break;
                }
                this->mFileBuffer = puVar14;
                uVar17 = uVar17 + 1;
              } while (*puVar14 != '\0');
            }
            this_00 = &p_Var4[0x13]._M_prev;
            local_188._0_8_ = local_188 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_188,puVar5,puVar14);
            std::__cxx11::string::operator=((string *)this_00,(string *)local_188);
            if ((pointer)local_188._0_8_ != (pointer)(local_188 + 0x10)) {
              operator_delete((void *)local_188._0_8_);
            }
            this->mFileBuffer = this->mFileBuffer + (2 - (ulong)((int)puVar14 - (int)puVar5 & 1));
            if (p_Var4[0x14]._M_next == (_List_node_base *)0x0) {
              snprintf(local_188,0x80,"Layer_%i");
              p_Var8 = p_Var4[0x14]._M_next;
              strlen(local_188);
              std::__cxx11::string::_M_replace((ulong)this_00,0,(char *)p_Var8,(ulong)local_188);
            }
            p_Var8 = (_List_node_base *)(this->configLayerName)._M_string_length;
            if ((p_Var8 == (_List_node_base *)0x0) ||
               ((bVar21 = true, p_Var8 == p_Var4[0x14]._M_next &&
                (iVar11 = bcmp((this->configLayerName)._M_dataplus._M_p,*this_00,(size_t)p_Var8),
                iVar11 == 0)))) {
              this->hasNamedLayer = true;
              bVar21 = bVar9;
            }
            puVar12 = (uint *)((long)this->mFileBuffer + 2);
            uVar10 = 0xffff;
            if (puVar12 <= puVar20) {
              uVar10 = *(ushort *)this->mFileBuffer;
              this->mFileBuffer = (uint8_t *)puVar12;
              uVar10 = uVar10 << 8 | uVar10 >> 8;
            }
            *(ushort *)&p_Var4[0x13]._M_next = uVar10;
            *(bool *)((long)&p_Var4[0x16]._M_next + 4) = bVar21;
          }
          else if (uVar18 == 0x504e5453) {
            if (!bVar21) {
              paVar6 = (this->mCurLayer->mTempPoints).
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
              paVar7 = (this->mCurLayer->mTempPoints).
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              LoadLWOPoints(this,uVar23);
              this->mCurLayer->mPointIDXOfs =
                   (int)((ulong)((long)paVar6 - (long)paVar7) >> 2) * -0x55555555;
            }
          }
          else if ((uVar18 == 0x504f4c53) && (!bVar21)) {
            pFVar2 = (this->mCurLayer->mFaces).
                     super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            pFVar3 = (this->mCurLayer->mFaces).
                     super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            LoadLWO2Polygons(this,uVar23);
            this->mCurLayer->mFaceIDXOfs = (uint)((ulong)((long)pFVar2 - (long)pFVar3) >> 5);
          }
        }
        else if ((int)uVar18 < 0x54414753) {
          if (uVar18 == 0x50544147) {
            if (!bVar21) {
              if ((this->mCurLayer->mFaces).
                  super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>._M_impl.
                  super__Vector_impl_data._M_start ==
                  (this->mCurLayer->mFaces).
                  super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                pLVar15 = DefaultLogger::get();
                message = "LWO2: Unexpected PTAG";
                goto LAB_0042c781;
              }
              LoadLWO2PolygonTags(this,uVar23);
            }
          }
          else if (uVar18 == 0x53555246) {
            LoadLWO2Surface(this,uVar23);
          }
        }
        else if (uVar18 == 0x54414753) {
          if ((this->mTags->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start ==
              (this->mTags->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            LoadLWOTags(this,uVar23);
          }
          else {
            pLVar15 = DefaultLogger::get();
            message = "LWO2: SRFS chunk encountered twice";
LAB_0042c781:
            Logger::warn(pLVar15,message);
          }
        }
        else {
          if (uVar18 == 0x564d4144) {
            if ((this->mCurLayer->mFaces).
                super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>._M_impl.
                super__Vector_impl_data._M_start ==
                (this->mCurLayer->mFaces).
                super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              pLVar15 = DefaultLogger::get();
              message = "LWO2: Unexpected VMAD chunk";
              goto LAB_0042c781;
            }
          }
          else if (uVar18 != 0x564d4150) goto LAB_0042c1d3;
          if (!bVar21) {
            if ((this->mCurLayer->mTempPoints).
                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                super__Vector_impl_data._M_start ==
                (this->mCurLayer->mTempPoints).
                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              pLVar15 = DefaultLogger::get();
              message = "LWO2: Unexpected VMAP chunk";
              goto LAB_0042c781;
            }
            LoadLWO2VertexMap(this,uVar23,uVar18 == 0x564d4144);
          }
        }
      }
LAB_0042c1d3:
      this->mFileBuffer = (uint8_t *)puVar20;
      puVar12 = puVar20 + 2;
    } while (puVar12 <= puVar22);
  }
  return;
}

Assistant:

void LWOImporter::LoadLWO2File()
{
    bool skip = false;

    LE_NCONST uint8_t* const end = mFileBuffer + fileSize;
    unsigned int iUnnamed = 0;
    while (true)
    {
        if (mFileBuffer + sizeof(IFF::ChunkHeader) > end)break;
        const IFF::ChunkHeader head = IFF::LoadChunk(mFileBuffer);

        if (mFileBuffer + head.length > end)
        {
            throw DeadlyImportError("LWO2: Chunk length points behind the file");
            break;
        }
        uint8_t* const next = mFileBuffer+head.length;

        if(!head.length) {
            mFileBuffer = next;
            continue;
        }

        switch (head.type)
        {
            // new layer
        case AI_LWO_LAYR:
            {
                // add a new layer to the list ....
                mLayers->push_back ( LWO::Layer() );
                LWO::Layer& layer = mLayers->back();
                mCurLayer = &layer;

                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,LAYR,16);

                // layer index.
                layer.mIndex = GetU2();

                // Continue loading this layer or ignore it? Check the layer index property
                if (UINT_MAX != configLayerIndex && (configLayerIndex-1) != layer.mIndex)   {
                    skip = true;
                }
                else skip = false;

                // pivot point
                mFileBuffer += 2; /* unknown */
                mCurLayer->mPivot.x = GetF4();
                mCurLayer->mPivot.y = GetF4();
                mCurLayer->mPivot.z = GetF4();
                GetS0(layer.mName,head.length-16);

                // if the name is empty, generate a default name
                if (layer.mName.empty())    {
                    char buffer[128]; // should be sufficiently large
                    ::ai_snprintf(buffer, 128, "Layer_%i", iUnnamed++);
                    layer.mName = buffer;
                }

                // load this layer or ignore it? Check the layer name property
                if (configLayerName.length() && configLayerName != layer.mName) {
                    skip = true;
                }
                else hasNamedLayer = true;

                // optional: parent of this layer
                if (mFileBuffer + 2 <= next)
                    layer.mParent = GetU2();
                else layer.mParent = -1;

                // Set layer skip parameter
                layer.skip = skip;

                break;
            }

            // vertex list
        case AI_LWO_PNTS:
            {
                if (skip)
                    break;

                unsigned int old = (unsigned int)mCurLayer->mTempPoints.size();
                LoadLWOPoints(head.length);
                mCurLayer->mPointIDXOfs = old;
                break;
            }
            // vertex tags
        case AI_LWO_VMAD:
            if (mCurLayer->mFaces.empty())
            {
                ASSIMP_LOG_WARN("LWO2: Unexpected VMAD chunk");
                break;
            }
            // --- intentionally no break here
        case AI_LWO_VMAP:
            {
                if (skip)
                    break;

                if (mCurLayer->mTempPoints.empty())
                    ASSIMP_LOG_WARN("LWO2: Unexpected VMAP chunk");
                else LoadLWO2VertexMap(head.length,head.type == AI_LWO_VMAD);
                break;
            }
            // face list
        case AI_LWO_POLS:
            {
                if (skip)
                    break;

                unsigned int old = (unsigned int)mCurLayer->mFaces.size();
                LoadLWO2Polygons(head.length);
                mCurLayer->mFaceIDXOfs = old;
                break;
            }
            // polygon tags
        case AI_LWO_PTAG:
            {
                if (skip)
                    break;

                if (mCurLayer->mFaces.empty()) {
                    ASSIMP_LOG_WARN("LWO2: Unexpected PTAG");
                } else {
                    LoadLWO2PolygonTags(head.length);
                }
                break;
            }
            // list of tags
        case AI_LWO_TAGS:
            {
                if (!mTags->empty()) {
                    ASSIMP_LOG_WARN("LWO2: SRFS chunk encountered twice");
                }   else {
                    LoadLWOTags(head.length);
                }
                break;
            }

            // surface chunk
        case AI_LWO_SURF:
            {
                LoadLWO2Surface(head.length);
                break;
            }

            // clip chunk
        case AI_LWO_CLIP:
            {
                LoadLWO2Clip(head.length);
                break;
            }

            // envelope chunk
        case AI_LWO_ENVL:
            {
                LoadLWO2Envelope(head.length);
                break;
            }
        }
        mFileBuffer = next;
    }
}